

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

bool __thiscall sptk::Matrix::GetDeterminant(Matrix *this,double *determinant)

{
  uint uVar1;
  pointer ppdVar2;
  double *pdVar3;
  double *pdVar4;
  bool bVar5;
  int row;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  uint num_row;
  bool bVar10;
  double dVar11;
  double determinant_of_submatrix;
  Matrix submatrix;
  double local_78;
  Matrix local_70;
  
  uVar1 = this->num_row_;
  if ((uVar1 == this->num_column_) && (determinant != (double *)0x0 && 0 < (int)uVar1)) {
    if (uVar1 == 1) {
      *determinant = **(this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      bVar10 = true;
    }
    else {
      num_row = uVar1 - 1;
      Matrix(&local_70,num_row,num_row);
      *determinant = 0.0;
      uVar9 = 0;
      bVar10 = false;
      do {
        ppdVar2 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar6 = 0;
        iVar7 = 0;
        do {
          if (uVar9 == uVar6) {
            iVar7 = 1;
          }
          pdVar3 = ppdVar2[(int)uVar6 + iVar7];
          pdVar4 = local_70.index_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6];
          uVar8 = 0;
          do {
            pdVar4[uVar8] = pdVar3[uVar8 + 1];
            uVar8 = uVar8 + 1;
          } while (num_row != uVar8);
          uVar6 = uVar6 + 1;
        } while (uVar6 != num_row);
        bVar5 = GetDeterminant(&local_70,&local_78);
        if (!bVar5) goto LAB_00108e72;
        dVar11 = *(this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9];
        if ((uVar9 & 1) != 0) {
          dVar11 = -dVar11;
        }
        *determinant = dVar11 * local_78 + *determinant;
        uVar9 = uVar9 + 1;
        bVar10 = uVar1 <= uVar9;
      } while (uVar9 != uVar1);
      bVar10 = true;
LAB_00108e72:
      ~Matrix(&local_70);
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool Matrix::GetDeterminant(double* determinant) const {
  if (num_row_ != num_column_ || num_row_ <= 0 || NULL == determinant) {
    return false;
  }

  const int num_dimension(num_row_);
  if (1 == num_dimension) {
    *determinant = index_[0][0];
    return true;
  }

  const int num_order(num_dimension - 1);
  Matrix submatrix(num_order, num_order);
  *determinant = 0.0;
  for (int i(0); i < num_dimension; ++i) {
    for (int row(0), offset(0); row < num_order; ++row) {
      if (i == row) {
        offset = 1;
      }
      for (int column(0); column < num_order; ++column) {
        submatrix[row][column] = index_[row + offset][column + 1];
      }
    }
    double determinant_of_submatrix;
    if (!submatrix.GetDeterminant(&determinant_of_submatrix)) {
      return false;
    }
    *determinant += ((0 == i % 2) ? index_[i][0] : -index_[i][0]) *
                    determinant_of_submatrix;
  }
  return true;
}